

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg1.c
# Opt level: O3

errr borg_keypress(keycode_t k)

{
  int16_t iVar1;
  short sVar2;
  errr eVar3;
  char *pcVar4;
  long lVar5;
  
  if (k == 0) {
    borg_note(" & Key * *BAD KEY * *");
    eVar3 = -1;
  }
  else {
    if (*borg_cfg != 0) {
      if (k - 0x20 < 0x5f) {
        pcVar4 = format("& Key <%c> (0x%02X)",k,k);
      }
      else {
        pcVar4 = format("& Key <0x%02X>",k);
      }
      borg_note(pcVar4);
    }
    iVar1 = borg_key_head;
    lVar5 = (long)borg_key_head;
    sVar2 = borg_key_head + 1;
    borg_key_head = sVar2;
    borg_key_queue[lVar5] = k;
    if (iVar1 == 0x1fff) {
      borg_key_head = 0;
      sVar2 = 0;
    }
    if (sVar2 == borg_key_tail) {
      borg_active = false;
      pcVar4 = format("# Aborting (%s).","overflow");
      borg_note(pcVar4);
      borg_key_tail = borg_key_head;
      borg_queued_direction = 0;
    }
    eVar3 = 0;
    if (borg_key_tail == 0x2000) {
      borg_key_tail = 0;
      eVar3 = 0;
    }
  }
  return eVar3;
}

Assistant:

errr borg_keypress(keycode_t k)
{
    /* Hack -- Refuse to enqueue "nul" */
    if (!k) {
        borg_note(" & Key * *BAD KEY * *");
        return (-1);
    }

    /* Hack -- note the keypress */
    if (borg_cfg[BORG_VERBOSE]) {
        if (k >= 32 && k <= 126) {
            borg_note(format("& Key <%c> (0x%02X)", k, k));
        } else {
            borg_note(format("& Key <0x%02X>", k));
        }
    }

    /* Store the char, advance the queue */
    borg_key_queue[borg_key_head++] = k;

    /* Circular queue, handle wrap */
    if (borg_key_head == KEY_SIZE)
        borg_key_head = 0;

    /* Hack -- Catch overflow (forget oldest) */
    if (borg_key_head == borg_key_tail)
        borg_oops("overflow");

    /* Hack -- Overflow may induce circular queue */
    if (borg_key_tail == KEY_SIZE)
        borg_key_tail = 0;

    /* Success */
    return (0);
}